

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall ExceptionFreeserf::~ExceptionFreeserf(ExceptionFreeserf *this)

{
  ExceptionFreeserf *this_local;
  
  *(undefined ***)this = &PTR__ExceptionFreeserf_001a5c50;
  std::__cxx11::string::~string((string *)&this->description);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

ExceptionFreeserf::~ExceptionFreeserf() {
}